

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O3

void pystring::os::path::splitext_generic
               (string *root,string *ext,string *p,string *sep,string *altsep,string *extsep)

{
  _Alloc_hider _Var1;
  int start;
  int iVar2;
  int iVar3;
  bool bVar4;
  string local_50;
  
  start = rfind(p,sep,0,0x7fffffff);
  if ((altsep->_M_string_length != 0) && (iVar2 = rfind(p,altsep,0,0x7fffffff), start <= iVar2)) {
    start = iVar2;
  }
  iVar2 = rfind(p,extsep,0,0x7fffffff);
  if (start < iVar2) {
    do {
      start = start + 1;
      if (iVar2 == start) goto LAB_00109773;
      slice(&local_50,p,start,0x7fffffff);
      _Var1._M_p = local_50._M_dataplus._M_p;
      if (local_50._M_string_length == extsep->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar4 = false;
        }
        else {
          iVar3 = bcmp(local_50._M_dataplus._M_p,(extsep->_M_dataplus)._M_p,
                       local_50._M_string_length);
          bVar4 = iVar3 != 0;
        }
      }
      else {
        bVar4 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_50.field_2) {
        operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (!bVar4);
    slice(&local_50,p,0,iVar2);
    std::__cxx11::string::operator=((string *)root,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    slice(&local_50,p,iVar2,0x7fffffff);
    std::__cxx11::string::operator=((string *)ext,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
LAB_00109773:
    std::__cxx11::string::_M_assign((string *)root);
    std::__cxx11::string::_M_assign((string *)ext);
  }
  return;
}

Assistant:

void splitext_generic(std::string & root, std::string & ext,
                          const std::string & p,
                          const std::string & sep,
                          const std::string & altsep,
                          const std::string & extsep)
    {
        int sepIndex = pystring::rfind(p, sep);
        if(!altsep.empty())
        {
            int altsepIndex = pystring::rfind(p, altsep);
            sepIndex = std::max(sepIndex, altsepIndex);
        }

        int dotIndex = pystring::rfind(p, extsep);
        if(dotIndex > sepIndex)
        {
            // Skip all leading dots
            int filenameIndex = sepIndex + 1;

            while(filenameIndex < dotIndex)
            {
                if(pystring::slice(p,filenameIndex) != extsep)
                {
                    root = pystring::slice(p, 0, dotIndex);
                    ext = pystring::slice(p, dotIndex);
                    return;
                }

                filenameIndex += 1;
            }
        }

        root = p;
        ext = empty_string;
    }